

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strtod.cc
# Opt level: O0

char * google::protobuf::io::anon_unknown_0::FloatToBuffer(float value,char *buffer)

{
  Nonnull<char_*> pcVar1;
  bool bVar2;
  uint uVar3;
  LogMessage *pLVar4;
  double dVar5;
  double dVar6;
  LogMessage local_b0;
  Voidify local_9d;
  int local_9c;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
  local_98;
  float local_88;
  byte local_81;
  float parsed_value;
  Voidify local_6d;
  int local_6c;
  FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
  local_68;
  int local_54;
  undefined1 local_50 [4];
  int snprintf_result;
  FormatSpecTemplate<> local_40;
  FormatSpecTemplate<> local_30;
  Nonnull<char_*> local_20;
  char *buffer_local;
  char *pcStack_10;
  float value_local;
  
  local_20 = buffer;
  buffer_local._4_4_ = value;
  dVar5 = std::numeric_limits<double>::infinity();
  pcVar1 = local_20;
  if (((double)value != dVar5) || (NAN((double)value) || NAN(dVar5))) {
    dVar5 = (double)buffer_local._4_4_;
    dVar6 = std::numeric_limits<double>::infinity();
    pcVar1 = local_20;
    if ((dVar5 != -dVar6) || (NAN(dVar5) || NAN(-dVar6))) {
      uVar3 = std::isnan((double)(ulong)(uint)buffer_local._4_4_);
      pcVar1 = local_20;
      if ((uVar3 & 1) == 0) {
        absl::lts_20250127::str_format_internal::
        FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
        ::FormatSpecTemplate(&local_68,"%.*g");
        local_6c = 6;
        local_54 = absl::lts_20250127::SNPrintF<int,_float>
                             (pcVar1,0x18,&local_68,&local_6c,(float *)((long)&buffer_local + 4));
        local_81 = 0;
        if (local_54 < 1 || 0x17 < local_54) {
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&parsed_value,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/strtod.cc"
                     ,0xbc,"snprintf_result > 0 && snprintf_result < kFloatToBufferSize");
          local_81 = 1;
          pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream
                             ((LogMessage *)&parsed_value);
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_6d,pLVar4);
        }
        if ((local_81 & 1) != 0) {
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&parsed_value);
        }
        bVar2 = safe_strtof(local_20,&local_88);
        pcVar1 = local_20;
        if (((!bVar2) || (local_88 != buffer_local._4_4_)) ||
           (NAN(local_88) || NAN(buffer_local._4_4_))) {
          absl::lts_20250127::str_format_internal::
          FormatSpecTemplate<(absl::lts_20250127::FormatConversionCharSet)655355,_(absl::lts_20250127::FormatConversionCharSet)654848>
          ::FormatSpecTemplate(&local_98,"%.*g");
          local_9c = 9;
          local_54 = absl::lts_20250127::SNPrintF<int,_float>
                               (pcVar1,0x18,&local_98,&local_9c,(float *)((long)&buffer_local + 4));
          if (local_54 < 1 || 0x17 < local_54) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_b0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/strtod.cc"
                       ,0xc4,"snprintf_result > 0 && snprintf_result < kFloatToBufferSize");
            pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
            absl::lts_20250127::log_internal::Voidify::operator&&(&local_9d,pLVar4);
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_b0);
          }
        }
        DelocalizeRadix(local_20);
        pcStack_10 = local_20;
      }
      else {
        absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                  ((FormatSpecTemplate<> *)local_50,"nan");
        absl::lts_20250127::SNPrintF<>(pcVar1,0x18,(FormatSpec<> *)local_50);
        pcStack_10 = local_20;
      }
    }
    else {
      absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
                (&local_40,"-inf");
      absl::lts_20250127::SNPrintF<>(pcVar1,0x18,&local_40);
      pcStack_10 = local_20;
    }
  }
  else {
    absl::lts_20250127::str_format_internal::FormatSpecTemplate<>::FormatSpecTemplate
              (&local_30,"inf");
    absl::lts_20250127::SNPrintF<>(pcVar1,0x18,&local_30);
    pcStack_10 = local_20;
  }
  return pcStack_10;
}

Assistant:

char *FloatToBuffer(float value, char *buffer) {
  // FLT_DIG is 6 for IEEE-754 floats, which are used on almost all
  // platforms these days.  Just in case some system exists where FLT_DIG
  // is significantly larger -- and risks overflowing our buffer -- we have
  // this assert.
  static_assert(FLT_DIG < 10, "FLT_DIG_is_too_big");

  if (value == std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "inf");
    return buffer;
  } else if (value == -std::numeric_limits<double>::infinity()) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "-inf");
    return buffer;
  } else if (std::isnan(value)) {
    absl::SNPrintF(buffer, kFloatToBufferSize, "nan");
    return buffer;
  }

  int snprintf_result =
      absl::SNPrintF(buffer, kFloatToBufferSize, "%.*g", FLT_DIG, value);

  // The snprintf should never overflow because the buffer is significantly
  // larger than the precision we asked for.
  ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);

  float parsed_value;
  if (!safe_strtof(buffer, &parsed_value) || parsed_value != value) {
    snprintf_result =
        absl::SNPrintF(buffer, kFloatToBufferSize, "%.*g", FLT_DIG + 3, value);

    // Should never overflow; see above.
    ABSL_DCHECK(snprintf_result > 0 && snprintf_result < kFloatToBufferSize);
  }

  DelocalizeRadix(buffer);
  return buffer;
}